

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

ostream * operator<<(ostream *out_stream,Date *date)

{
  undefined8 in_RAX;
  long lVar1;
  ostream *poVar2;
  undefined8 uStack_28;
  
  lVar1 = *(long *)out_stream;
  poVar2 = out_stream + *(long *)(lVar1 + -0x18);
  uStack_28 = in_RAX;
  if (out_stream[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar1 = *(long *)out_stream;
  }
  poVar2[0xe0] = (ostream)0x30;
  *(undefined8 *)(out_stream + *(long *)(lVar1 + -0x18) + 0x10) = 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out_stream,date->year);
  uStack_28._0_7_ = CONCAT16(0x2d,(undefined6)uStack_28);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_28 + 6),1);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out_stream,date->month);
  uStack_28 = CONCAT17(0x2d,(undefined7)uStack_28);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_28 + 7),1);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out_stream,date->day);
  return poVar2;
}

Assistant:

ostream& operator<<(ostream& out_stream, const Date& date) {
    out_stream << setfill('0') << setw(4);
    out_stream << date.GetYear() << '-' << setw(2);
    out_stream << date.GetMonth() << '-' << setw(2);

    return out_stream << date.GetDay();
}